

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

GenerateBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::GenerateBlockSyntax_const&>
          (BumpAllocator *this,GenerateBlockSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  NamedBlockClauseSyntax *pNVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  GenerateBlockSyntax *pGVar10;
  
  pGVar10 = (GenerateBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((GenerateBlockSyntax *)this->endPtr < pGVar10 + 1) {
    pGVar10 = (GenerateBlockSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(pGVar10 + 1);
  }
  (pGVar10->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pGVar10->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar10->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pGVar10->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pGVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pGVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pGVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cb67f8;
  TVar6 = (args->begin).kind;
  uVar7 = (args->begin).field_0x2;
  NVar8.raw = (args->begin).numFlags.raw;
  uVar9 = (args->begin).rawLen;
  pIVar3 = (args->begin).info;
  pNVar4 = args->beginName;
  pGVar10->label = args->label;
  (pGVar10->begin).kind = TVar6;
  (pGVar10->begin).field_0x2 = uVar7;
  (pGVar10->begin).numFlags = (NumericTokenFlags)NVar8.raw;
  (pGVar10->begin).rawLen = uVar9;
  (pGVar10->begin).info = pIVar3;
  pGVar10->beginName = pNVar4;
  uVar5 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar10->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar10->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pGVar10->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar10->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pGVar10->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pGVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pGVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pGVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cbe9e8;
  uVar7 = (args->end).field_0x2;
  NVar8.raw = (args->end).numFlags.raw;
  uVar9 = (args->end).rawLen;
  pIVar3 = (args->end).info;
  (pGVar10->end).kind = (args->end).kind;
  (pGVar10->end).field_0x2 = uVar7;
  (pGVar10->end).numFlags = (NumericTokenFlags)NVar8.raw;
  (pGVar10->end).rawLen = uVar9;
  (pGVar10->end).info = pIVar3;
  pGVar10->endName = args->endName;
  return pGVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }